

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenElementSegmentRef
BinaryenAddPassiveElementSegment
          (BinaryenModuleRef module,char *name,char **funcNames,BinaryenIndex numFuncNames)

{
  pointer pEVar1;
  Fatal *pFVar2;
  ElementSegment *pEVar3;
  string_view local_210;
  Builder local_200;
  RefFunc *local_1f8;
  Fatal local_1f0;
  string_view local_68;
  Function *local_58;
  Function *func;
  BinaryenIndex i;
  string_view local_40;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> local_30;
  __single_object segment;
  BinaryenIndex numFuncNames_local;
  char **funcNames_local;
  char *name_local;
  BinaryenModuleRef module_local;
  
  segment._M_t.
  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
  super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl._4_4_ = numFuncNames;
  std::make_unique<wasm::ElementSegment>();
  pEVar1 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
           operator->(&local_30);
  wasm::Name::Name((Name *)&local_40,name);
  wasm::Named::setExplicitName(&pEVar1->super_Named,(Name)local_40);
  func._0_4_ = 0;
  while( true ) {
    if (segment._M_t.
        super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t
        .super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl._4_4_ <= (uint)func) {
      pEVar3 = wasm::Module::addElementSegment(module,&local_30);
      std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
                (&local_30);
      return pEVar3;
    }
    wasm::Name::Name((Name *)&local_68,funcNames[(uint)func]);
    local_58 = wasm::Module::getFunctionOrNull(module,(Name)local_68);
    if (local_58 == (Function *)0x0) break;
    pEVar1 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
             operator->(&local_30);
    wasm::Builder::Builder(&local_200,module);
    wasm::Name::Name((Name *)&local_210,funcNames[(uint)func]);
    local_1f8 = wasm::Builder::makeRefFunc(&local_200,(Name)local_210,(HeapType)(local_58->type).id)
    ;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (&pEVar1->data,(value_type *)&local_1f8);
    func._0_4_ = (uint)func + 1;
  }
  wasm::Fatal::Fatal(&local_1f0);
  pFVar2 = wasm::Fatal::operator<<(&local_1f0,(char (*) [19])"invalid function \'");
  pFVar2 = wasm::Fatal::operator<<(pFVar2,funcNames + (uint)func);
  wasm::Fatal::operator<<(pFVar2,(char (*) [3])"\'.");
  wasm::Fatal::~Fatal(&local_1f0);
}

Assistant:

BinaryenElementSegmentRef
BinaryenAddPassiveElementSegment(BinaryenModuleRef module,
                                 const char* name,
                                 const char** funcNames,
                                 BinaryenIndex numFuncNames) {
  auto segment = std::make_unique<ElementSegment>();
  segment->setExplicitName(name);
  for (BinaryenIndex i = 0; i < numFuncNames; i++) {
    auto* func = ((Module*)module)->getFunctionOrNull(funcNames[i]);
    if (func == nullptr) {
      Fatal() << "invalid function '" << funcNames[i] << "'.";
    }
    segment->data.push_back(
      Builder(*(Module*)module).makeRefFunc(funcNames[i], func->type));
  }
  return ((Module*)module)->addElementSegment(std::move(segment));
}